

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderSubroutineTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::ShaderSubroutine::FunctionalTest3_4::checkProgramResourceiv
          (FunctionalTest3_4 *this,GLuint program_id,GLenum program_interface,GLenum pname,
          GLchar *resource_name,GLint expected)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLchar *pGVar3;
  GLchar *pGVar4;
  GLint value;
  GLenum pname_local;
  GLchar *local_1b8;
  undefined1 local_1b0 [384];
  long lVar2;
  
  pname_local = pname;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  iVar1 = (**(code **)(lVar2 + 0x9a8))(program_id,program_interface,resource_name);
  value = 0;
  if (iVar1 != -1) {
    local_1b8 = resource_name;
    (**(code **)(lVar2 + 0x9c8))(program_id,program_interface,iVar1,1,&pname_local,1,0,&value);
    err = (**(code **)(lVar2 + 0x800))();
    glu::checkError(err,"getProgramResourceiv",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderSubroutineTests.cpp"
                    ,0xc12);
    if (value == expected) {
      return true;
    }
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,"Error. Invalid result. Function: getProgramResourceiv. ");
    std::operator<<((ostream *)this_00,"Program interface: ");
    pGVar3 = Utils::programInterfaceToStr(program_interface);
    pGVar4 = local_1b8;
    std::operator<<((ostream *)this_00,pGVar3);
    std::operator<<((ostream *)this_00,". ");
    std::operator<<((ostream *)this_00,"Resource name: ");
    std::operator<<((ostream *)this_00,pGVar4);
    std::operator<<((ostream *)this_00,". ");
    std::operator<<((ostream *)this_00,"Property: ");
    pGVar4 = Utils::pnameToStr(pname_local);
    std::operator<<((ostream *)this_00,pGVar4);
    std::operator<<((ostream *)this_00,". ");
    std::operator<<((ostream *)this_00,"Result: ");
    std::ostream::operator<<(this_00,value);
    std::operator<<((ostream *)this_00,". ");
    std::operator<<((ostream *)this_00,"Expected: ");
    std::ostream::operator<<(this_00,expected);
    std::operator<<((ostream *)this_00,".");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
  }
  return false;
}

Assistant:

bool FunctionalTest3_4::checkProgramResourceiv(GLuint program_id, GLenum program_interface, GLenum pname,
											   const glw::GLchar* resource_name, GLint expected) const
{
	const glw::Functions& gl	= m_context.getRenderContext().getFunctions();
	GLuint				  index = gl.getProgramResourceIndex(program_id, program_interface, resource_name);
	GLint				  value = 0;

	if (GL_INVALID_INDEX == index)
	{
		return false;
	}

	gl.getProgramResourceiv(program_id, program_interface, index, 1, &pname, 1, 0, &value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "getProgramResourceiv");

	if (expected != value)
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message << "Error. Invalid result. Function: getProgramResourceiv. "
			<< "Program interface: " << Utils::programInterfaceToStr(program_interface) << ". "
			<< "Resource name: " << resource_name << ". "
			<< "Property: " << Utils::pnameToStr(pname) << ". "
			<< "Result: " << value << ". "
			<< "Expected: " << expected << "." << tcu::TestLog::EndMessage;

		return false;
	}
	else
	{
		return true;
	}
}